

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean jpeg_fill_bit_buffer
                  (bitread_working_state *state,bit_buf_type get_buffer,int bits_left,int nbits)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  int in_ECX;
  byte *pbVar4;
  int in_EDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  int c;
  j_decompress_ptr cinfo;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  uint local_3c;
  long local_30;
  byte *local_28;
  int local_1c;
  ulong local_18;
  
  local_28 = (byte *)*in_RDI;
  local_30 = in_RDI[1];
  plVar1 = (long *)in_RDI[4];
  local_1c = in_EDX;
  local_18 = in_RSI;
  if (*(int *)((long)plVar1 + 0x21c) == 0) {
    for (; local_1c < 0x39; local_1c = local_1c + 8) {
      if (local_30 == 0) {
        iVar2 = (**(code **)(plVar1[5] + 0x18))(plVar1);
        if (iVar2 == 0) {
          return 0;
        }
        local_28 = *(byte **)plVar1[5];
        local_30 = *(long *)(plVar1[5] + 8);
      }
      local_30 = local_30 + -1;
      pbVar4 = local_28 + 1;
      local_3c = (uint)*local_28;
      local_28 = pbVar4;
      if (local_3c == 0xff) {
        do {
          if (local_30 == 0) {
            iVar2 = (**(code **)(plVar1[5] + 0x18))(plVar1);
            if (iVar2 == 0) {
              return 0;
            }
            local_28 = *(byte **)plVar1[5];
            local_30 = *(long *)(plVar1[5] + 8);
          }
          local_30 = local_30 + -1;
          pbVar4 = local_28 + 1;
          uVar3 = (uint)*local_28;
          local_28 = pbVar4;
        } while (uVar3 == 0xff);
        if (uVar3 != 0) {
          *(uint *)((long)plVar1 + 0x21c) = uVar3;
          goto LAB_00148768;
        }
        local_3c = 0xff;
      }
      local_18 = local_18 << 8 | (long)(int)local_3c;
    }
  }
  else {
LAB_00148768:
    if (local_1c < in_ECX) {
      if (*(int *)(plVar1[0x4a] + 0x10) == 0) {
        *(undefined4 *)(*plVar1 + 0x28) = 0x75;
        (**(code **)(*plVar1 + 8))(plVar1,0xffffffff);
        *(undefined4 *)(plVar1[0x4a] + 0x10) = 1;
      }
      local_18 = local_18 << (0x39U - (char)local_1c & 0x3f);
      local_1c = 0x39;
    }
  }
  *in_RDI = local_28;
  in_RDI[1] = local_30;
  in_RDI[2] = local_18;
  *(int *)(in_RDI + 3) = local_1c;
  return 1;
}

Assistant:

GLOBAL(boolean)
jpeg_fill_bit_buffer(bitread_working_state *state,
                     register bit_buf_type get_buffer, register int bits_left,
                     int nbits)
/* Load up the bit buffer to a depth of at least nbits */
{
  /* Copy heavily used state fields into locals (hopefully registers) */
  register const JOCTET *next_input_byte = state->next_input_byte;
  register size_t bytes_in_buffer = state->bytes_in_buffer;
  j_decompress_ptr cinfo = state->cinfo;

  /* Attempt to load at least MIN_GET_BITS bits into get_buffer. */
  /* (It is assumed that no request will be for more than that many bits.) */
  /* We fail to do so only if we hit a marker or are forced to suspend. */

  if (cinfo->unread_marker == 0) {      /* cannot advance past a marker */
    while (bits_left < MIN_GET_BITS) {
      register int c;

      /* Attempt to read a byte */
      if (bytes_in_buffer == 0) {
        if (!(*cinfo->src->fill_input_buffer) (cinfo))
          return FALSE;
        next_input_byte = cinfo->src->next_input_byte;
        bytes_in_buffer = cinfo->src->bytes_in_buffer;
      }
      bytes_in_buffer--;
      c = *next_input_byte++;

      /* If it's 0xFF, check and discard stuffed zero byte */
      if (c == 0xFF) {
        /* Loop here to discard any padding FF's on terminating marker,
         * so that we can save a valid unread_marker value.  NOTE: we will
         * accept multiple FF's followed by a 0 as meaning a single FF data
         * byte.  This data pattern is not valid according to the standard.
         */
        do {
          if (bytes_in_buffer == 0) {
            if (!(*cinfo->src->fill_input_buffer) (cinfo))
              return FALSE;
            next_input_byte = cinfo->src->next_input_byte;
            bytes_in_buffer = cinfo->src->bytes_in_buffer;
          }
          bytes_in_buffer--;
          c = *next_input_byte++;
        } while (c == 0xFF);

        if (c == 0) {
          /* Found FF/00, which represents an FF data byte */
          c = 0xFF;
        } else {
          /* Oops, it's actually a marker indicating end of compressed data.
           * Save the marker code for later use.
           * Fine point: it might appear that we should save the marker into
           * bitread working state, not straight into permanent state.  But
           * once we have hit a marker, we cannot need to suspend within the
           * current MCU, because we will read no more bytes from the data
           * source.  So it is OK to update permanent state right away.
           */
          cinfo->unread_marker = c;
          /* See if we need to insert some fake zero bits. */
          goto no_more_bytes;
        }
      }

      /* OK, load c into get_buffer */
      get_buffer = (get_buffer << 8) | c;
      bits_left += 8;
    } /* end while */
  } else {
no_more_bytes:
    /* We get here if we've read the marker that terminates the compressed
     * data segment.  There should be enough bits in the buffer register
     * to satisfy the request; if so, no problem.
     */
    if (nbits > bits_left) {
      /* Uh-oh.  Report corrupted data to user and stuff zeroes into
       * the data stream, so that we can produce some kind of image.
       * We use a nonvolatile flag to ensure that only one warning message
       * appears per data segment.
       */
      if (!cinfo->entropy->insufficient_data) {
        WARNMS(cinfo, JWRN_HIT_MARKER);
        cinfo->entropy->insufficient_data = TRUE;
      }
      /* Fill the buffer with zero bits */
      get_buffer <<= MIN_GET_BITS - bits_left;
      bits_left = MIN_GET_BITS;
    }
  }

  /* Unload the local registers */
  state->next_input_byte = next_input_byte;
  state->bytes_in_buffer = bytes_in_buffer;
  state->get_buffer = get_buffer;
  state->bits_left = bits_left;

  return TRUE;
}